

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall
CConnman::OpenNetworkConnection
          (CConnman *this,CAddress *addrConnect,bool fCountFailure,CSemaphoreGrant *grant_outbound,
          char *pszDest,ConnectionType conn_type,bool use_v2transport)

{
  bool bVar1;
  CNode *pCVar2;
  ServiceFlags SVar3;
  array<unsigned_int,_7UL> *this_00;
  reference pvVar4;
  long in_RDI;
  char *in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  bool banned_or_discouraged;
  CNode *pnode;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock82;
  bool in_stack_0000019f;
  ConnectionType in_stack_000001a0;
  bool in_stack_000001a7;
  CAddress *in_stack_000001a8;
  CConnman *in_stack_000001b0;
  char *in_stack_00000390;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  CNode *in_stack_fffffffffffffee0;
  CAddress *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  CService *in_stack_fffffffffffffef8;
  undefined8 *puVar5;
  CConnman *in_stack_ffffffffffffff00;
  CNetAddr *in_stack_ffffffffffffff08;
  char *pszName;
  BanMan *in_stack_ffffffffffffff10;
  CNode *mutexIn;
  CAddress *in_stack_ffffffffffffff18;
  CConnman *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  bool local_ca;
  bool local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_71 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            ((char *)in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
             in_stack_fffffffffffffedc,(Mutex *)0x20f394);
  if (in_R9D == 0) {
    __assert_fail("conn_type != ConnectionType::INBOUND",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                  ,0xb6f,
                  "void CConnman::OpenNetworkConnection(const CAddress &, bool, CSemaphoreGrant &&, const char *, ConnectionType, bool)"
                 );
  }
  bVar1 = CThreadInterrupt::operator_cast_to_bool
                    ((CThreadInterrupt *)
                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  if ((!bVar1) &&
     (bVar1 = std::atomic::operator_cast_to_bool
                        ((atomic<bool> *)
                         CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)), bVar1)) {
    if (in_R8 == (char *)0x0) {
      local_c9 = false;
      if (*(long *)(in_RDI + 0x270) != 0) {
        bVar1 = BanMan::IsDiscouraged(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        local_ca = true;
        if (!bVar1) {
          local_ca = BanMan::IsBanned((BanMan *)in_stack_ffffffffffffff20,
                                      (CNetAddr *)in_stack_ffffffffffffff18);
        }
        local_c9 = local_ca;
      }
      bVar1 = IsLocal(in_stack_fffffffffffffef8);
      if (((bVar1) || (local_c9 != false)) ||
         (bVar1 = AlreadyConnectedToAddress(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18),
         bVar1)) goto LAB_0020f745;
    }
    else {
      this_01 = local_71;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_01,in_R8,(allocator<char> *)in_stack_ffffffffffffff18);
      pCVar2 = FindNode(in_stack_ffffffffffffff00,(string *)in_stack_fffffffffffffef8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      std::allocator<char>::~allocator((allocator<char> *)local_71);
      if (pCVar2 != (CNode *)0x0) goto LAB_0020f745;
      in_stack_ffffffffffffff18 = (CAddress *)0x0;
    }
    pszName = (char *)((long)&local_71[0].field_2 + 1);
    CAddress::CAddress(in_stack_fffffffffffffee8,(CAddress *)in_stack_fffffffffffffee0);
    pCVar2 = ConnectNode(in_stack_000001b0,in_stack_000001a8,in_stack_00000390,in_stack_000001a7,
                         in_stack_000001a0,in_stack_0000019f);
    CAddress::~CAddress((CAddress *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    if (pCVar2 != (CNode *)0x0) {
      mutexIn = pCVar2;
      CSemaphoreGrant::operator=
                ((CSemaphoreGrant *)in_stack_fffffffffffffee8,
                 (CSemaphoreGrant *)in_stack_fffffffffffffee0);
      puVar5 = *(undefined8 **)(in_RDI + 0x268);
      SVar3 = std::atomic::operator_cast_to_ServiceFlags
                        ((atomic<ServiceFlags> *)
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      (**(code **)*puVar5)(puVar5,pCVar2,SVar3);
      MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                ((AnnotatedMixin<std::recursive_mutex> *)
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff18,
                 (AnnotatedMixin<std::recursive_mutex> *)mutexIn,pszName,(char *)pCVar2,
                 (int)((ulong)puVar5 >> 0x20),SUB81((ulong)puVar5 >> 0x18,0));
      std::vector<CNode_*,_std::allocator<CNode_*>_>::push_back
                ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffee8,
                 (value_type *)in_stack_fffffffffffffee0);
      bVar1 = CNode::IsManualOrFullOutboundConn(in_stack_fffffffffffffee0);
      if (bVar1) {
        this_00 = (array<unsigned_int,_7UL> *)(in_RDI + 0x1dc);
        CNetAddr::GetNetwork((CNetAddr *)in_stack_fffffffffffffee0);
        pvVar4 = std::array<unsigned_int,_7UL>::operator[]
                           (this_00,(size_type)in_stack_fffffffffffffee0);
        *pvVar4 = *pvVar4 + 1;
      }
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    }
  }
LAB_0020f745:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::OpenNetworkConnection(const CAddress& addrConnect, bool fCountFailure, CSemaphoreGrant&& grant_outbound, const char *pszDest, ConnectionType conn_type, bool use_v2transport)
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    assert(conn_type != ConnectionType::INBOUND);

    //
    // Initiate outbound network connection
    //
    if (interruptNet) {
        return;
    }
    if (!fNetworkActive) {
        return;
    }
    if (!pszDest) {
        bool banned_or_discouraged = m_banman && (m_banman->IsDiscouraged(addrConnect) || m_banman->IsBanned(addrConnect));
        if (IsLocal(addrConnect) || banned_or_discouraged || AlreadyConnectedToAddress(addrConnect)) {
            return;
        }
    } else if (FindNode(std::string(pszDest)))
        return;

    CNode* pnode = ConnectNode(addrConnect, pszDest, fCountFailure, conn_type, use_v2transport);

    if (!pnode)
        return;
    pnode->grantOutbound = std::move(grant_outbound);

    m_msgproc->InitializeNode(*pnode, nLocalServices);
    {
        LOCK(m_nodes_mutex);
        m_nodes.push_back(pnode);

        // update connection count by network
        if (pnode->IsManualOrFullOutboundConn()) ++m_network_conn_counts[pnode->addr.GetNetwork()];
    }
}